

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O3

void TPZShapeHCurl<pzshape::TPZShapeLinear>::CalcH1ShapeOrders
               (TPZVec<int> *ordHCurl,TPZVec<int> *ordH1)

{
  int iVar1;
  MElementType MVar2;
  int iVar3;
  int **ppiVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  int *ihSide;
  int *piVar8;
  TPZStack<int,_10> highDimSides;
  TPZManVector<int,_10> local_78;
  
  if (ordH1->fNElements != 1) {
    local_78.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0xffffffff;
    (*ordH1->_vptr_TPZVec[2])(ordH1,1);
  }
  iVar1 = pztopology::TPZLine::SideDimension(2);
  MVar2 = pztopology::TPZLine::Type(2);
  uVar6 = 1;
  if (MVar2 != EQuadrilateral) {
    MVar2 = pztopology::TPZLine::Type(2);
    if (MVar2 != ECube) {
      MVar2 = pztopology::TPZLine::Type(2);
      uVar6 = (uint)(MVar2 == EPrisma);
    }
  }
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
  pztopology::TPZLine::HigherDimensionSides(2,(TPZStack<int,_10> *)&local_78);
  iVar7 = *ordHCurl->fStore;
  ppiVar4 = TPZVec<int>::begin(&local_78.super_TPZVec<int>);
  piVar8 = *ppiVar4;
  piVar5 = TPZVec<int>::end(&local_78.super_TPZVec<int>);
  iVar7 = iVar7 + uVar6;
  if (piVar8 != piVar5) {
    do {
      iVar3 = pztopology::TPZLine::SideDimension(*piVar8);
      if (iVar3 != iVar1 + 1) break;
      iVar3 = ordHCurl->fStore[(long)*piVar8 + -2];
      MVar2 = pztopology::TPZLine::Type(*piVar8);
      uVar6 = 1;
      if (MVar2 != EQuadrilateral) {
        MVar2 = pztopology::TPZLine::Type(*piVar8);
        if (MVar2 != ECube) {
          MVar2 = pztopology::TPZLine::Type(*piVar8);
          uVar6 = (uint)(MVar2 == EPrisma);
        }
      }
      iVar3 = uVar6 + iVar3;
      if (iVar7 <= iVar3) {
        iVar7 = iVar3;
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar5);
  }
  *ordH1->fStore = iVar7;
  TPZManVector<int,_10>::~TPZManVector(&local_78);
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::CalcH1ShapeOrders(
    const TPZVec<int> &ordHCurl,
    TPZVec<int> &ordH1)
{
    constexpr auto nConnects = TSHAPE::NSides-TSHAPE::NCornerNodes;
    if(ordH1.size() != nConnects)  ordH1.Resize(nConnects,-1);
    for(auto iCon = 0; iCon < nConnects; iCon++){
        const auto iSide = iCon + TSHAPE::NCornerNodes;
        const auto sideDim = TSHAPE::SideDimension(iSide);
        const bool quadSide =
            TSHAPE::Type(iSide) == EQuadrilateral ||
            TSHAPE::Type(iSide) == ECube ||
            TSHAPE::Type(iSide) == EPrisma;
        /*some H1 functions associated with the side iSide of dimension dim
          might be needed for computing the shape functions of a side with
          dimension dim+1 that contains the side iSide.
          It is also worth noting that quadrilateral sides require functions
          of ordH1er k+1*/
        TPZStack<int> highDimSides;
        TSHAPE::HigherDimensionSides(iSide, highDimSides);
        const auto sideOrder = ordHCurl[iCon];
        auto maxOrder = quadSide ? sideOrder + 1: sideOrder;
        for(auto &ihSide : highDimSides){
            if(TSHAPE::SideDimension(ihSide) != sideDim+1) break;
            else {
                const auto hSideOrder = ordHCurl[ihSide-TSHAPE::NCornerNodes];
                const auto hQuadSide =
                    TSHAPE::Type(ihSide) == EQuadrilateral ||
                    TSHAPE::Type(ihSide) == ECube ||
                    TSHAPE::Type(ihSide) == EPrisma;
                const auto hMaxOrder = hQuadSide ? hSideOrder + 1 : hSideOrder;
                maxOrder = std::max(maxOrder, hMaxOrder);
            }
        }
        ordH1[iCon] = maxOrder;
    }
}